

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O2

BinaryType loader::anon_unknown_0::determine_binary_type(istream *is)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  istream *piVar3;
  BinaryType BVar4;
  
  piVar3 = (istream *)std::istream::seekg(is,0,0);
  uVar1 = util::load<short,util::little_endian>(piVar3);
  BVar4 = PEMagic2;
  if ((uVar1 == 0x5a4d) &&
     (BVar4 = PEMagic2, (*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) == 0))
  {
    piVar3 = (istream *)std::istream::seekg(is,0x3c,0);
    uVar1 = util::load<short,util::little_endian>(piVar3);
    BVar4 = DOSMagic;
    if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
      piVar3 = (istream *)std::istream::seekg(is,uVar1,0);
      uVar1 = util::load<short,util::little_endian>(piVar3);
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        if (uVar1 == 0x4550) {
          uVar2 = util::load<short,util::little_endian>(is);
          if (uVar2 != 0) {
            return DOSMagic;
          }
          if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
            return DOSMagic;
          }
        }
        BVar4 = (BinaryType)uVar1;
      }
    }
  }
  return BVar4;
}

Assistant:

BinaryType determine_binary_type(std::istream & is) {
	
	boost::uint16_t dos_magic = util::load<boost::uint16_t>(is.seekg(0));
	if(is.fail() || dos_magic != DOSMagic) {
		return UnknownBinary; // Not a DOS file
	}
	
	// Skip the DOS stub
	boost::uint16_t new_offset = util::load<boost::uint16_t>(is.seekg(0x3c));
	if(is.fail()) {
		return DOSMagic;
	}
	
	boost::uint16_t new_magic = util::load<boost::uint16_t>(is.seekg(new_offset));
	if(is.fail()) {
		return DOSMagic;
	}
	
	if(new_magic == PEMagic) {
		boost::uint16_t pe2_magic = util::load<boost::uint16_t>(is);
		if(is.fail() || pe2_magic != PEMagic2) {
			return DOSMagic;
		}
	}
	
	return BinaryType(new_magic);
}